

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> *
mxx::impl::surplus_send_pairing
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          vector<long,_std::allocator<long>_> *surpluses,int p,int rank,bool send_deficit)

{
  pointer puVar1;
  uint uVar2;
  pointer plVar3;
  long lVar4;
  long *plVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  undefined7 in_register_00000081;
  ulong uVar11;
  long lVar12;
  int rank_1;
  queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
  fifo;
  pair<int,_long> local_a8;
  uint local_98;
  undefined4 local_94;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_90;
  _Deque_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> local_88;
  ulong local_38;
  
  local_94 = (undefined4)CONCAT71(in_register_00000081,send_deficit);
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_98 = rank;
  local_90 = __return_storage_ptr__;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,(long)p,(value_type_conflict2 *)&local_88,
             (allocator_type *)&local_a8);
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::_M_initialize_map
            (&local_88,0);
  if (0 < p) {
    uVar11 = (ulong)local_98;
    uVar9 = 0;
    do {
      plVar3 = (surpluses->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = plVar3[uVar9];
      if (lVar4 != 0) {
        uVar8 = (uint)uVar9;
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
          local_a8.second = plVar3[uVar9];
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            local_a8.first = uVar8;
            std::deque<std::pair<int,long>,std::allocator<std::pair<int,long>>>::
            _M_push_back_aux<std::pair<int,long>>
                      ((deque<std::pair<int,long>,std::allocator<std::pair<int,long>>> *)&local_88,
                       &local_a8);
          }
          else {
LAB_00165581:
            *(ulong *)local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 CONCAT44(local_a8._4_4_,uVar8);
            (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = local_a8.second;
            local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            local_a8.first = uVar8;
          }
        }
        else if (lVar4 < 1) {
          if (lVar4 < 0) {
            if ((local_88._M_impl.super__Deque_impl_data._M_start._M_cur)->second < 0) {
              local_a8.second = plVar3[uVar9];
              if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                  local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) goto LAB_00165581;
              local_a8.first = uVar8;
              std::deque<std::pair<int,long>,std::allocator<std::pair<int,long>>>::
              _M_push_back_aux<std::pair<int,long>>
                        ((deque<std::pair<int,long>,std::allocator<std::pair<int,long>>> *)&local_88
                         ,&local_a8);
            }
            else {
              plVar3 = (surpluses->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              lVar4 = plVar3[uVar9];
              if (lVar4 < 0) {
                plVar5 = plVar3 + uVar9;
                if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                    local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
                  bVar10 = uVar9 == uVar11 & (byte)local_94;
                  local_38 = uVar11;
                  do {
                    lVar12 = (local_88._M_impl.super__Deque_impl_data._M_start._M_cur)->second;
                    lVar7 = -lVar4;
                    if (SBORROW8(lVar12,-lVar4) != lVar12 + lVar4 < 0) {
                      lVar7 = lVar12;
                    }
                    uVar2 = (local_88._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
                    *plVar5 = lVar4 + lVar7;
                    plVar5 = &(local_88._M_impl.super__Deque_impl_data._M_start._M_cur)->second;
                    *plVar5 = *plVar5 - lVar7;
                    if (*plVar5 == 0) {
                      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
                          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
                        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first);
                        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
                             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
                        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
                             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x20;
                        uVar11 = local_38;
                        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
                             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
                        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
                             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
                      }
                      else {
                        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
                             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
                      }
                    }
                    uVar6 = (long)(int)uVar2;
                    if ((bVar10 != 0) || (uVar6 = uVar9, uVar2 == local_98)) {
                      puVar1 = (local_90->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start + uVar6;
                      *puVar1 = *puVar1 + lVar7;
                    }
                    plVar3 = (surpluses->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                             super__Vector_impl_data._M_start;
                    lVar4 = plVar3[uVar9];
                    if (-1 < lVar4) goto LAB_001656cb;
                    plVar5 = plVar3 + uVar9;
                  } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                           local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
                }
                if (lVar4 < 0) {
                  local_a8.second = *plVar5;
                  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1)
                  goto LAB_00165581;
                  local_a8.first = uVar8;
                  std::deque<std::pair<int,long>,std::allocator<std::pair<int,long>>>::
                  _M_push_back_aux<std::pair<int,long>>
                            ((deque<std::pair<int,long>,std::allocator<std::pair<int,long>>> *)
                             &local_88,&local_a8);
                }
              }
            }
          }
        }
        else if ((local_88._M_impl.super__Deque_impl_data._M_start._M_cur)->second < 1) {
          while( true ) {
            plVar3 = (surpluses->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar4 = plVar3[uVar9];
            if (lVar4 < 1) break;
            plVar5 = plVar3 + uVar9;
            if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
              if (0 < lVar4) {
                local_a8.second = *plVar5;
                if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                    local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1)
                goto LAB_00165581;
                local_a8.first = uVar8;
                std::deque<std::pair<int,long>,std::allocator<std::pair<int,long>>>::
                _M_push_back_aux<std::pair<int,long>>
                          ((deque<std::pair<int,long>,std::allocator<std::pair<int,long>>> *)
                           &local_88,&local_a8);
              }
              break;
            }
            lVar12 = -(local_88._M_impl.super__Deque_impl_data._M_start._M_cur)->second;
            if (lVar4 < -(local_88._M_impl.super__Deque_impl_data._M_start._M_cur)->second) {
              lVar12 = lVar4;
            }
            uVar2 = (local_88._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
            *plVar5 = lVar4 - lVar12;
            plVar5 = &(local_88._M_impl.super__Deque_impl_data._M_start._M_cur)->second;
            *plVar5 = *plVar5 + lVar12;
            if (*plVar5 == 0) {
              if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
                  local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
                operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first);
                local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
                     local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
                local_88._M_impl.super__Deque_impl_data._M_start._M_last =
                     local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x20;
                local_88._M_impl.super__Deque_impl_data._M_start._M_first =
                     local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
                local_88._M_impl.super__Deque_impl_data._M_start._M_node =
                     local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
              }
              else {
                local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
                     local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
              }
            }
            uVar6 = (long)(int)uVar2;
            if ((uVar9 == uVar11) || (uVar6 = uVar9, (char)local_94 == '\x01' && uVar2 == local_98))
            {
              puVar1 = (local_90->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start + uVar6;
              *puVar1 = *puVar1 + lVar12;
            }
          }
        }
        else {
          local_a8.second = plVar3[uVar9];
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
              local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) goto LAB_00165581;
          local_a8.first = uVar8;
          std::deque<std::pair<int,long>,std::allocator<std::pair<int,long>>>::
          _M_push_back_aux<std::pair<int,long>>
                    ((deque<std::pair<int,long>,std::allocator<std::pair<int,long>>> *)&local_88,
                     &local_a8);
        }
      }
LAB_001656cb:
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uint)p);
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_a8);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)(uint)local_a8.first,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
           ,0xbd,"surplus_send_pairing","fifo.empty()");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  std::_Deque_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::~_Deque_base
            (&local_88);
  return local_90;
}

Assistant:

inline std::vector<size_t> surplus_send_pairing(std::vector<signed_size_t>& surpluses, int p, int rank, bool send_deficit = true) {
    // calculate the send and receive counts by a linear scan over
    // the surpluses, using a queue to keep track of all surpluses
    std::vector<size_t> send_counts(p, 0);
    std::queue<std::pair<int, signed_size_t> > fifo;
    for (int i = 0; i < p; ++i) {
        if (surpluses[i] == 0)
            continue;
        if (fifo.empty()) {
            fifo.push(std::make_pair(i, surpluses[i]));
        } else if (surpluses[i] > 0) {
            if (fifo.front().second > 0) {
                fifo.push(std::make_pair(i, surpluses[i]));
            } else {
                while (surpluses[i] > 0 && !fifo.empty())
                {
                    long long min = std::min(surpluses[i], -fifo.front().second);
                    int j = fifo.front().first;
                    surpluses[i] -= min;
                    fifo.front().second += min;
                    if (fifo.front().second == 0)
                        fifo.pop();
                    // these processors communicate!
                    if (rank == i)
                        send_counts[j] += min;
                    else if (rank == j && send_deficit)
                        send_counts[i] += min;
                }
                if (surpluses[i] > 0)
                    fifo.push(std::make_pair(i, surpluses[i]));
            }
        } else if (surpluses[i] < 0) {
            if (fifo.front().second < 0) {
                fifo.push(std::make_pair(i, surpluses[i]));
            } else {
                while (surpluses[i] < 0 && !fifo.empty())
                {
                    long long min = std::min(-surpluses[i], fifo.front().second);
                    int j = fifo.front().first;
                    surpluses[i] += min;
                    fifo.front().second -= min;
                    if (fifo.front().second == 0)
                        fifo.pop();
                    // these processors communicate!
                    if (rank == i && send_deficit)
                        send_counts[j] += min;
                    else if (rank == j)
                        send_counts[i] += min;
                }
                if (surpluses[i] < 0)
                    fifo.push(std::make_pair(i, surpluses[i]));
            }
        }
    }
    MXX_ASSERT(fifo.empty());

    return send_counts;
}